

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

Triangle * __thiscall SceneParser::parseTriangle(SceneParser *this)

{
  int iVar1;
  Triangle *this_00;
  Vector3f local_cc;
  undefined1 local_c0 [8];
  Vector3f n;
  Vector3f b;
  Vector3f a;
  Vector3f v2;
  Vector3f v1;
  Vector3f v0;
  char token [100];
  SceneParser *this_local;
  
  getToken(this,(char *)(v0.m_elements + 1));
  iVar1 = strcmp((char *)(v0.m_elements + 1),"{");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x18b,"Triangle *SceneParser::parseTriangle()");
  }
  getToken(this,(char *)(v0.m_elements + 1));
  iVar1 = strcmp((char *)(v0.m_elements + 1),"vertex0");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"vertex0\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x18d,"Triangle *SceneParser::parseTriangle()");
  }
  readVector3f((SceneParser *)(v1.m_elements + 1));
  getToken(this,(char *)(v0.m_elements + 1));
  iVar1 = strcmp((char *)(v0.m_elements + 1),"vertex1");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"vertex1\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,400,"Triangle *SceneParser::parseTriangle()");
  }
  readVector3f((SceneParser *)(v2.m_elements + 1));
  getToken(this,(char *)(v0.m_elements + 1));
  iVar1 = strcmp((char *)(v0.m_elements + 1),"vertex2");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"vertex2\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x193,"Triangle *SceneParser::parseTriangle()");
  }
  readVector3f((SceneParser *)(a.m_elements + 1));
  getToken(this,(char *)(v0.m_elements + 1));
  iVar1 = strcmp((char *)(v0.m_elements + 1),"}");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x196,"Triangle *SceneParser::parseTriangle()");
  }
  if (this->_current_material != (Material *)0x0) {
    ::operator-((Vector3f *)(b.m_elements + 1),(Vector3f *)(v2.m_elements + 1));
    ::operator-((Vector3f *)(n.m_elements + 1),(Vector3f *)(a.m_elements + 1));
    Vector3f::cross(&local_cc,(Vector3f *)(b.m_elements + 1),(Vector3f *)(n.m_elements + 1));
    Vector3f::normalized((Vector3f *)local_c0);
    this_00 = (Triangle *)operator_new(0x78);
    Triangle::Triangle(this_00,(Vector3f *)(v1.m_elements + 1),(Vector3f *)(v2.m_elements + 1),
                       (Vector3f *)(a.m_elements + 1),(Vector3f *)local_c0,(Vector3f *)local_c0,
                       (Vector3f *)local_c0,this->_current_material);
    return this_00;
  }
  __assert_fail("_current_material != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x197,"Triangle *SceneParser::parseTriangle()");
}

Assistant:

Triangle *
SceneParser::parseTriangle() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "vertex0"));
    Vector3f v0 = readVector3f();
    getToken(token);
    assert(!strcmp(token, "vertex1"));
    Vector3f v1 = readVector3f();
    getToken(token);
    assert(!strcmp(token, "vertex2"));
    Vector3f v2 = readVector3f();
    getToken(token);
    assert(!strcmp(token, "}"));
    assert(_current_material != NULL);
    Vector3f a = v1 - v0;
    Vector3f b = v2 - v0;
    Vector3f n = Vector3f::cross(a, b).normalized();
    return new Triangle(v0, v1, v2, n, n, n, _current_material);
}